

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment.c
# Opt level: O3

void EmitUncompressedMetaBlock
               (uint8_t *begin,uint8_t *end,size_t storage_ix_start,size_t *storage_ix,
               uint8_t *storage)

{
  uint uVar1;
  size_t len;
  ulong uVar2;
  
  len = (long)end - (long)begin;
  storage[storage_ix_start >> 3] =
       storage[storage_ix_start >> 3] & ~(-1 << ((byte)storage_ix_start & 7));
  *storage_ix = storage_ix_start;
  BrotliStoreMetaBlockHeader(len,1,storage_ix,storage);
  uVar1 = (int)*storage_ix + 7;
  *storage_ix = (ulong)(uVar1 & 0xfffffff8);
  memcpy(storage + (uVar1 >> 3),begin,len);
  uVar2 = len * 8 + *storage_ix;
  *storage_ix = uVar2;
  storage[uVar2 >> 3] = '\0';
  return;
}

Assistant:

static void EmitUncompressedMetaBlock(const uint8_t* begin, const uint8_t* end,
                                      const size_t storage_ix_start,
                                      size_t* storage_ix, uint8_t* storage) {
  const size_t len = (size_t)(end - begin);
  RewindBitPosition(storage_ix_start, storage_ix, storage);
  BrotliStoreMetaBlockHeader(len, 1, storage_ix, storage);
  *storage_ix = (*storage_ix + 7u) & ~7u;
  memcpy(&storage[*storage_ix >> 3], begin, len);
  *storage_ix += len << 3;
  storage[*storage_ix >> 3] = 0;
}